

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O3

BasicValue *
cvm::Ncurses::InitPair
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  _List_node_base *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = -1;
  if ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl._M_node.
      _M_size == 3) {
    p_Var1 = (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
    iVar2 = BasicValue::toInt((BasicValue *)(p_Var1 + 1));
    iVar3 = BasicValue::toInt((BasicValue *)(p_Var1->_M_next + 1));
    iVar4 = BasicValue::toInt((BasicValue *)
                              ((Args->
                               super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>).
                               _M_impl._M_node.super__List_node_base._M_prev + 1));
    iVar2 = init_pair((int)(short)iVar2,(int)(short)iVar3,(int)(short)iVar4);
  }
  __return_storage_ptr__->Type = IntType;
  (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->StrVal).field_2;
  (__return_storage_ptr__->StrVal)._M_string_length = 0;
  (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->field_2).IntVal = iVar2;
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::InitPair(std::list<BasicValue> &Args) {
  if (Args.size() != 3)
    return ERR;

  auto Iterator = Args.cbegin();

  short PairNo = static_cast<short>(Iterator->toInt());
  ++Iterator;
  short FgColor = static_cast<short>(Iterator->toInt());
  short BgColor = static_cast<short>(Args.back().toInt());

  return ::init_pair(PairNo, FgColor, BgColor);
}